

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

MSize lj_tab_len(GCtab *t)

{
  uint uVar1;
  uint64_t uVar2;
  size_t lo;
  ulong uVar3;
  cTValue *pcVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  lo = (size_t)t->asize;
  uVar5 = lo - 1;
  if (lo == 0) {
    uVar5 = 0;
  }
  if ((uVar5 == 0) || (uVar2 = (t->array).ptr64, *(long *)(uVar2 + uVar5 * 8) != -1)) {
    if (t->hmask != 0) {
      uVar1 = t->asize;
      uVar3 = uVar5 + 1;
      do {
        uVar7 = uVar3;
        uVar6 = (uint)uVar7;
        if (uVar6 < uVar1) {
          pcVar4 = (cTValue *)((long)(int)uVar6 * 8 + (t->array).ptr64);
        }
        else {
          pcVar4 = lj_tab_getinth(t,uVar6);
        }
        if ((pcVar4 == (cTValue *)0x0) || (pcVar4->u64 == 0xffffffffffffffff)) goto LAB_00126a87;
        uVar3 = uVar7 * 2;
        uVar5 = uVar7;
      } while (uVar7 < 0x3fffffff);
      uVar6 = 0;
      lVar8 = 0x100000000;
      do {
        uVar5 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
        if (uVar6 < uVar1) {
          pcVar4 = (cTValue *)((lVar8 >> 0x1d) + (t->array).ptr64);
        }
        else {
          pcVar4 = lj_tab_getinth(t,uVar6);
        }
      } while ((pcVar4 != (cTValue *)0x0) &&
              (lVar8 = lVar8 + 0x100000000, pcVar4->u64 != 0xffffffffffffffff));
      goto LAB_00126a6f;
    }
    uVar3 = uVar5 & 0xffffffff;
  }
  else {
    uVar3 = 0;
    while (uVar7 = uVar5, 1 < uVar7 - uVar3) {
      uVar5 = uVar3 + uVar7 >> 1;
      if (*(long *)(uVar2 + uVar5 * 8) != -1) {
        uVar3 = uVar5;
        uVar5 = uVar7;
      }
    }
  }
  return (MSize)uVar3;
LAB_00126a87:
  while (uVar3 = uVar7, 1 < uVar3 - uVar5) {
    uVar9 = uVar3 + uVar5 >> 1;
    uVar6 = (uint)uVar9;
    if (uVar6 < uVar1) {
      pcVar4 = (cTValue *)((long)(int)uVar6 * 8 + (t->array).ptr64);
    }
    else {
      pcVar4 = lj_tab_getinth(t,uVar6);
    }
    uVar7 = uVar9;
    if ((pcVar4 != (cTValue *)0x0) && (pcVar4->u64 != 0xffffffffffffffff)) {
      uVar7 = uVar3;
      uVar5 = uVar9;
    }
  }
LAB_00126a6f:
  return (MSize)uVar5;
}

Assistant:

MSize LJ_FASTCALL lj_tab_len(GCtab *t)
{
  size_t hi = (size_t)t->asize;
  if (hi) hi--;
  /* In a growing array the last array element is very likely nil. */
  if (hi > 0 && LJ_LIKELY(tvisnil(arrayslot(t, hi)))) {
    /* Binary search to find a non-nil to nil transition in the array. */
    size_t lo = 0;
    while (hi - lo > 1) {
      size_t mid = (lo+hi) >> 1;
      if (tvisnil(arrayslot(t, mid))) hi = mid; else lo = mid;
    }
    return (MSize)lo;
  }
  /* Without a hash part, there's an implicit nil after the last element. */
  return t->hmask ? tab_len_slow(t, hi) : (MSize)hi;
}